

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

void __thiscall Refal2::CArbitraryInteger::GetTextValue(CArbitraryInteger *this,string *text)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  string local_248 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [35];
  char local_1e5;
  int local_1e4;
  ostringstream local_1e0 [8];
  ostringstream stringStream;
  undefined1 local_68 [8];
  CArbitraryInteger decimal;
  undefined1 local_38 [8];
  CArbitraryInteger tmp;
  string *text_local;
  CArbitraryInteger *this_local;
  
  tmp._24_8_ = text;
  removeLeadingZeros(this);
  bVar2 = IsZero(this);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)tmp._24_8_,"0");
  }
  else {
    std::__cxx11::string::clear();
    CArbitraryInteger((CArbitraryInteger *)local_38);
    Copy(this,(CArbitraryInteger *)local_38);
    while (bVar2 = IsZero((CArbitraryInteger *)local_38), uVar1 = tmp._24_8_,
          ((bVar2 ^ 0xffU) & 1) != 0) {
      CArbitraryInteger((CArbitraryInteger *)local_68,10000000);
      Div((CArbitraryInteger *)local_38,(CArbitraryInteger *)local_68);
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      if (sVar3 != 1) {
        __assert_fail("decimal.size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                      ,0x73,"void Refal2::CArbitraryInteger::GetTextValue(std::string &) const");
      }
      std::__cxx11::ostringstream::ostringstream(local_1e0);
      local_1e4 = (int)std::setw(7);
      poVar4 = std::operator<<((ostream *)local_1e0,(_Setw)local_1e4);
      local_1e5 = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,local_1e5);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,0);
      std::ostream::operator<<(poVar4,*pvVar5);
      std::__cxx11::ostringstream::str();
      std::operator+(local_208,local_228);
      std::__cxx11::string::operator=((string *)tmp._24_8_,(string *)local_208);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::string::~string((string *)local_228);
      std::__cxx11::ostringstream::~ostringstream(local_1e0);
      ~CArbitraryInteger((CArbitraryInteger *)local_68);
    }
    std::__cxx11::string::find_first_not_of(tmp.isNegative,0x30);
    std::__cxx11::string::erase(uVar1,0);
    bVar2 = IsNegative(this);
    if (bVar2) {
      std::operator+((char *)local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x181b1b);
      std::__cxx11::string::operator=((string *)tmp._24_8_,local_248);
      std::__cxx11::string::~string(local_248);
    }
    ~CArbitraryInteger((CArbitraryInteger *)local_38);
  }
  return;
}

Assistant:

void CArbitraryInteger::GetTextValue( std::string& text ) const
{
	const_cast<CArbitraryInteger&>( *this ).removeLeadingZeros();
	if( IsZero() ) {
		text = "0";
		return;
	}
	text.clear();
	CArbitraryInteger tmp;
	Copy( tmp );
	while( !tmp.IsZero() ) {
		CArbitraryInteger decimal( 10000000 );
		tmp.Div( decimal );
		assert( decimal.size() == 1 );
		std::ostringstream stringStream;
		stringStream << std::setw( 7 ) << std::setfill( '0' ) << decimal[0];
		text = stringStream.str() + text;
	}
	text.erase( 0, text.find_first_not_of( '0' ) );
	if( IsNegative() ) {
		text = "-" + text;
	}
}